

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  size_type *psVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  DeathTest *this_00;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  int death_test_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  int local_c4;
  RE *local_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  int local_54;
  string local_50;
  
  local_c0 = regex;
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  iVar3 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_;
  iVar4 = iVar3 + 1;
  ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_ = iVar4;
  local_c4 = iVar4;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    if (pIVar2->index_ <= iVar3) {
      StreamableToString<int>(&local_50,&local_c4);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x13233b);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_68 = *plVar7;
        lStack_60 = plVar5[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar7;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_a8 = *puVar8;
        lStack_a0 = plVar5[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *puVar8;
        local_b8 = (ulong *)*plVar5;
      }
      local_b0 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_54 = pIVar2->index_;
      StreamableToString<int>(&local_98,&local_54);
      uVar9 = 0xf;
      if (local_b8 != &local_a8) {
        uVar9 = local_a8;
      }
      if (uVar9 < local_98._M_string_length + local_b0) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          uVar10 = local_98.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_98._M_string_length + local_b0) goto LAB_0011da47;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
      }
      else {
LAB_0011da47:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98._M_dataplus._M_p)
        ;
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar1 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_108.field_2._M_allocated_capacity = *psVar1;
        local_108.field_2._8_8_ = puVar6[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar1;
        local_108._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_108._M_string_length = puVar6[1];
      *puVar6 = psVar1;
      puVar6[1] = 0;
      *(undefined1 *)psVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_d8 = *plVar7;
        lStack_d0 = plVar5[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar7;
        local_e8 = (long *)*plVar5;
      }
      local_e0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return false;
      }
      goto LAB_0011dc56;
    }
    iVar3 = std::__cxx11::string::compare((char *)pIVar2);
    if (((iVar3 != 0) || (pIVar2->line_ != line)) || (pIVar2->index_ != iVar4)) {
      *test = (DeathTest *)0x0;
      return true;
    }
  }
  iVar4 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
  if (iVar4 == 0) {
    this_00 = (DeathTest *)operator_new(0x40);
    DeathTest::DeathTest(this_00);
    this_00[1]._vptr_DeathTest = (_func_int **)statement;
    this_00[2]._vptr_DeathTest = (_func_int **)local_c0;
    *(undefined1 *)&this_00[3]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_00[3]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_00[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
    this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_001445c0;
    this_00[6]._vptr_DeathTest = (_func_int **)file;
    *(int *)&this_00[7]._vptr_DeathTest = line;
  }
  else {
    iVar4 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
    if (iVar4 != 0) {
      std::operator+(&local_108,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_d8 = *plVar7;
        lStack_d0 = plVar5[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar7;
        local_e8 = (long *)*plVar5;
      }
      local_e0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      local_50.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return false;
      }
LAB_0011dc56:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      return false;
    }
    this_00 = (DeathTest *)operator_new(0x30);
    DeathTest::DeathTest(this_00);
    this_00[1]._vptr_DeathTest = (_func_int **)statement;
    this_00[2]._vptr_DeathTest = (_func_int **)local_c0;
    *(undefined1 *)&this_00[3]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_00[3]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_00[4]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
    this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00144568;
  }
  *test = this_00;
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }